

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O1

void __thiscall SSTable::fillData(SSTable *this,SSTableData *new_data)

{
  pointer *ppSVar1;
  pointer pSVar2;
  pointer pSVar3;
  longlong lVar4;
  longlong lVar5;
  vector<SSTableIndexItem,_std::allocator<SSTableIndexItem>_> *this_00;
  iterator __position;
  vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *this_01;
  SSTableIndex *pSVar6;
  SSTableHeader *pSVar7;
  SSTableDataEntry *item;
  pointer pSVar8;
  iterator __end1;
  size_t sVar9;
  SSTableIndexItem local_40;
  
  this_01 = (vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)operator_new(0x18);
  std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::vector(this_01,new_data);
  this->data = this_01;
  pSVar2 = (this_01->super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pSVar3 = (this_01->super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  lVar4 = pSVar2->key;
  lVar5 = pSVar3[-1].key;
  pSVar6 = (SSTableIndex *)operator_new(0x18);
  (pSVar6->super__Vector_base<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pSVar6->super__Vector_base<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pSVar6->super__Vector_base<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->index = pSVar6;
  sVar9 = 0x20;
  if (pSVar2 != pSVar3) {
    pSVar8 = pSVar2;
    do {
      this_00 = this->index;
      local_40.key = pSVar8->key;
      __position._M_current =
           (this_00->super__Vector_base<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      local_40.offset = sVar9;
      if (__position._M_current ==
          (this_00->super__Vector_base<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>)._M_impl
          .super__Vector_impl_data._M_end_of_storage) {
        std::vector<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>::
        _M_realloc_insert<SSTableIndexItem>(this_00,__position,&local_40);
      }
      else {
        (__position._M_current)->key = local_40.key;
        (__position._M_current)->offset = sVar9;
        ppSVar1 = &(this_00->super__Vector_base<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
      sVar9 = sVar9 + (pSVar8->value)._M_string_length + 0x19;
      pSVar8 = pSVar8 + 1;
    } while (pSVar8 != pSVar3);
  }
  pSVar7 = (SSTableHeader *)operator_new(0x20);
  pSVar7->index_offset = sVar9;
  pSVar7->entries_count = (long)pSVar3 - (long)pSVar2 >> 6;
  pSVar7->key_min = lVar4;
  pSVar7->key_max = lVar5;
  this->header = pSVar7;
  return;
}

Assistant:

void SSTable::fillData(SSTableData &new_data) {
    data = new SSTableData{new_data};
    long long key_min = 0, key_max = 0;
    size_t file_offset = 0, entries_count = data->size();
    // Determining header.
    key_min = data->begin()->key;
    key_max = data->rbegin()->key;
    file_offset = 32; // Header use 32 bytes.
    size_t item_bytes = 0;
    index = new SSTableIndex{};
    for (const auto &item:*data) {
        index->push_back({item.key, file_offset});
        item_bytes = size_of_entry(item);
        file_offset += item_bytes;
    }
    header = new SSTableHeader{file_offset, entries_count, key_min, key_max};
}